

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O1

void UCAFL::_uc_hook_new_tb(uc_engine *uc,uc_tb *cur_tb,uc_tb *prev_tb,void *user_data)

{
  ssize_t sVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  afl_child_ret tsl_req;
  undefined1 local_14 [4];
  
  sVar1 = write(*(int *)((long)user_data + 0x80),local_14,4);
  __x = extraout_XMM0_Qa;
  if (sVar1 == 4) {
    write(*(int *)((long)user_data + 0x80),cur_tb,8);
    __x = extraout_XMM0_Qa_00;
  }
  log(__x);
  return;
}

Assistant:

static void _uc_hook_new_tb(uc_engine* uc, uc_tb* cur_tb, uc_tb* prev_tb,
                                void* user_data) {
        UCAFL* ucafl = (UCAFL*)user_data;
        enum afl_child_ret tsl_req = AFL_CHILD_TSL_REQUEST;

        // TODO: Gen unique id for the edge.
        if ((write(_W(ucafl->afl_child_pipe_), &tsl_req,
                   sizeof(enum afl_child_ret))) != sizeof(enum afl_child_ret) ||
            (write(_W(ucafl->afl_child_pipe_), &cur_tb->pc, 8) != 8)) {
            ERR_CHILD("Fail to request cache at 0x%" PRIx64 "\n", cur_tb->pc);
            return;
        }

        ERR_CHILD("A new TB is generated at 0x%" PRIx64 "\n", cur_tb->pc);
    }